

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  uint uVar1;
  pinger_t *pinger_00;
  long lVar2;
  size_t sVar3;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  pinger_t *pinger;
  ssize_t i;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  pinger_00 = (pinger_t *)stream->data;
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
              ,0x82,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    puts("got EOF");
    free(buf->base);
    uv_close(stream,pinger_on_close);
  }
  else {
    for (pinger = (pinger_t *)0x0; (long)pinger < nread;
        pinger = (pinger_t *)((long)&pinger->vectored_writes + 1)) {
      lVar2 = (long)*(char *)((long)&pinger->vectored_writes + (long)buf->base);
      if (lVar2 != pinger_00->pong[pinger_00->state]) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
                ,0x8e,"buf->base[i]","==","pinger->pong[pinger->state]",lVar2,"==",
                (long)pinger_00->pong[pinger_00->state]);
        abort();
      }
      uVar1 = pinger_00->state;
      sVar3 = strlen(pinger_00->pong);
      pinger_00->state = (uint)((ulong)(uVar1 + 1) % sVar3);
      if (pinger_00->state == 0) {
        printf("PONG %d\n",(ulong)pinger_00->pongs);
        pinger_00->pongs = pinger_00->pongs + 1;
        if (999 < pinger_00->pongs) {
          uv_close(stream,pinger_on_close);
          break;
        }
        pinger_write_ping(pinger_00);
      }
    }
    free(buf->base);
  }
  return;
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*) stream->data;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, pinger_on_close);

    return;
  }

  /* Now we count the pongs */
  for (i = 0; i < nread; i++) {
    ASSERT_EQ(buf->base[i], pinger->pong[pinger->state]);
    pinger->state = (pinger->state + 1) % strlen(pinger->pong);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*) stream, pinger_on_close);
      break;
    }
  }

  free(buf->base);
}